

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall
presolve::HPresolve::changeImplColUpper
          (HPresolve *this,HighsInt col,double newUpper,HighsInt originRow)

{
  int iVar1;
  pointer pdVar2;
  pointer piVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  HighsInt *pHVar7;
  double *pdVar8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  double dVar9;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar10;
  HighsInt local_58;
  undefined4 local_54;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_50;
  double local_48;
  HighsInt local_3c;
  long local_38;
  
  local_48 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[col];
  iVar1 = (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  dVar9 = (this->model->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col] - this->primal_feastol;
  local_58 = col;
  local_50 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)newUpper;
  if ((dVar9 <= local_48) && (newUpper < dVar9)) {
    markChangedCol(this,col);
  }
  lVar5 = (long)local_58;
  dVar9 = (this->model->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5];
  if ((dVar9 <= -INFINITY) ||
     (dVar9 - this->primal_feastol <=
      (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5])) {
    pdVar2 = (this->model->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar9 = pdVar2[lVar5] + this->primal_feastol;
    if (dVar9 < local_48) {
      local_54 = (undefined4)CONCAT71((int7)((ulong)pdVar2 >> 8),(double)local_50 <= dVar9);
      goto LAB_0030d289;
    }
  }
  local_54 = 0;
LAB_0030d289:
  if (iVar1 != originRow) {
    if ((iVar1 != -1) &&
       (iVar1 != (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5])) {
      this_00 = &(this->colImplSourceByRow).
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar1]._M_t;
      pVar10 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
               equal_range(this_00,&local_58);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux(this_00,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node);
    }
    if (originRow != -1) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_emplace_unique<int&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 ((this->colImplSourceByRow).
                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + originRow),&local_58);
    }
    (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[local_58] = originRow;
  }
  lVar5 = (long)local_58;
  (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[lVar5] = (double)local_50;
  if ((char)local_54 == '\0') {
    if (local_48 <= (double)local_50) {
      local_50 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_48;
    }
    if ((this->model->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar5] <= (double)local_50) {
      return;
    }
  }
  lVar5 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5];
  if (lVar5 != -1) {
    piVar3 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar5;
    pHVar7 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar5;
    local_50 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               &this->substitutionOpportunities;
    local_38 = (long)iVar1;
    do {
      HighsLinearSumBounds::updatedImplVarUpper
                (&this->impliedRowBounds,*pHVar7,local_58,*pdVar8,local_48,(HighsInt)local_38);
      if (((char)local_54 != '\0') && (bVar4 = isDualImpliedFree(this,*pHVar7), bVar4)) {
        local_3c = *pHVar7;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                  (local_50,&local_3c,&local_58);
      }
      markChangedRow(this,*pHVar7);
      lVar6 = (long)(int)lVar5;
      lVar5 = (long)piVar3[lVar6];
      pHVar7 = pHVar7 + (lVar5 - lVar6);
      pdVar8 = pdVar8 + (lVar5 - lVar6);
    } while (lVar5 != -1);
  }
  return;
}

Assistant:

void HPresolve::changeImplColUpper(HighsInt col, double newUpper,
                                   HighsInt originRow) {
  double oldImplUpper = implColUpper[col];
  HighsInt oldUpperSource = colUpperSource[col];
  if (oldImplUpper >= model->col_upper_[col] - primal_feastol &&
      newUpper < model->col_upper_[col] - primal_feastol) {
    // the dual constraint can be considered a >= constraint and was free, or a
    // <= constraint before
    markChangedCol(col);
  }
  bool newImpliedFree =
      isLowerImplied(col) &&
      oldImplUpper > model->col_upper_[col] + primal_feastol &&
      newUpper <= model->col_upper_[col] + primal_feastol;

  // remember the source of this upper bound, so that we can correctly identify
  // weak domination
  if (oldUpperSource != originRow) {
    if (oldUpperSource != -1 && oldUpperSource != colLowerSource[col])
      colImplSourceByRow[oldUpperSource].erase(col);
    if (originRow != -1) colImplSourceByRow[originRow].emplace(col);

    colUpperSource[col] = originRow;
  }

  // update implied bound
  implColUpper[col] = newUpper;

  // if the old and the new implied bound are not better than the upper bound,
  // nothing needs to be updated
  if (!newImpliedFree &&
      std::min(oldImplUpper, newUpper) >= model->col_upper_[col])
    return;

  for (const HighsSliceNonzero& nonzero : getColumnVector(col)) {
    impliedRowBounds.updatedImplVarUpper(nonzero.index(), col, nonzero.value(),
                                         oldImplUpper, oldUpperSource);
    if (newImpliedFree && isDualImpliedFree(nonzero.index()))
      substitutionOpportunities.emplace_back(nonzero.index(), col);

    markChangedRow(nonzero.index());
  }
}